

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O1

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ad,realtype droptol,int sparsetype)

{
  long *plVar1;
  long M;
  long N;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  SUNMatrix_ID SVar5;
  SUNMatrix p_Var6;
  sunindextype NNZ;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  if (droptol < 0.0 || 1 < (uint)sparsetype) {
    return (SUNMatrix)0x0;
  }
  SVar5 = SUNMatGetID(Ad);
  if (SVar5 == SUNMATRIX_BAND) {
    plVar1 = (long *)Ad->content;
    M = *plVar1;
    N = plVar1[1];
    if (N < 1) {
      NNZ = 0;
    }
    else {
      lVar8 = -plVar1[3];
      lVar10 = 0;
      lVar11 = 0;
      NNZ = 0;
      do {
        lVar12 = 0;
        if (0 < lVar8) {
          lVar12 = lVar8;
        }
        lVar14 = lVar11 - plVar1[3];
        if (lVar14 < 1) {
          lVar14 = 0;
        }
        lVar15 = plVar1[4] + lVar11;
        if (M <= plVar1[4] + lVar11) {
          lVar15 = M + -1;
        }
        if (lVar14 <= lVar15) {
          lVar12 = lVar12 + -1;
          do {
            NNZ = NNZ + (ulong)(droptol <
                               ABS(*(double *)
                                    (lVar10 + plVar1[5] * 8 + *(long *)(plVar1[8] + lVar11 * 8) + 8
                                    + lVar12 * 8)));
            lVar12 = lVar12 + 1;
          } while (lVar12 < lVar15);
        }
        lVar11 = lVar11 + 1;
        lVar8 = lVar8 + 1;
        lVar10 = lVar10 + -8;
      } while (lVar11 != N);
    }
    p_Var6 = SUNSparseMatrix(M,N,NNZ,sparsetype);
    if (p_Var6 != (SUNMatrix)0x0) {
      if (sparsetype == 0) {
        lVar8 = N;
        if (N < 1) {
          lVar10 = 0;
        }
        else {
          pvVar2 = p_Var6->content;
          lVar11 = *(long *)((long)pvVar2 + 0x38);
          pvVar3 = Ad->content;
          lVar12 = 0;
          lVar14 = 0;
          lVar10 = 0;
          do {
            *(long *)(lVar11 + lVar14 * 8) = lVar10;
            lVar15 = lVar14 - *(long *)((long)pvVar3 + 0x18);
            if (lVar15 < 1) {
              lVar15 = 0;
            }
            lVar7 = *(long *)((long)pvVar3 + 0x20) + lVar14;
            if (M <= lVar7) {
              lVar7 = M + -1;
            }
            if (lVar15 <= lVar7) {
              lVar7 = *(long *)(*(long *)((long)pvVar3 + 0x40) + lVar14 * 8) + lVar12;
              do {
                if (droptol < ABS(*(double *)
                                   (lVar7 + *(long *)((long)pvVar3 + 0x28) * 8 + lVar15 * 8))) {
                  *(long *)(*(long *)((long)pvVar2 + 0x30) + lVar10 * 8) = lVar15;
                  *(undefined8 *)(*(long *)((long)pvVar2 + 0x20) + lVar10 * 8) =
                       *(undefined8 *)(lVar7 + *(long *)((long)pvVar3 + 0x28) * 8 + lVar15 * 8);
                  lVar10 = lVar10 + 1;
                }
                lVar13 = *(long *)((long)pvVar3 + 0x20) + lVar14;
                if (M <= lVar13) {
                  lVar13 = M + -1;
                }
                bVar4 = lVar15 < lVar13;
                lVar15 = lVar15 + 1;
              } while (bVar4);
            }
            lVar14 = lVar14 + 1;
            lVar12 = lVar12 + -8;
          } while (lVar14 != N);
        }
      }
      else {
        lVar8 = M;
        if (M < 1) {
          lVar10 = 0;
        }
        else {
          pvVar2 = p_Var6->content;
          lVar11 = *(long *)((long)pvVar2 + 0x38);
          pvVar3 = Ad->content;
          lVar12 = 0;
          lVar14 = 0;
          lVar10 = 0;
          do {
            *(long *)(lVar11 + lVar14 * 8) = lVar10;
            lVar7 = lVar14 - *(long *)((long)pvVar3 + 0x20);
            lVar15 = 0;
            if (0 < lVar7) {
              lVar15 = lVar7;
            }
            lVar13 = *(long *)((long)pvVar3 + 0x18) + lVar14;
            if (N <= lVar13) {
              lVar13 = N + -1;
            }
            if (lVar15 <= lVar13) {
              if (lVar7 < 1) {
                lVar7 = 0;
              }
              lVar13 = *(long *)((long)pvVar3 + 0x40);
              lVar7 = lVar12 + lVar7 * -8;
              do {
                lVar9 = *(long *)(lVar13 + lVar15 * 8);
                if (droptol < ABS(*(double *)(lVar7 + *(long *)((long)pvVar3 + 0x28) * 8 + lVar9)))
                {
                  *(long *)(*(long *)((long)pvVar2 + 0x30) + lVar10 * 8) = lVar15;
                  *(undefined8 *)(*(long *)((long)pvVar2 + 0x20) + lVar10 * 8) =
                       *(undefined8 *)(lVar7 + *(long *)((long)pvVar3 + 0x28) * 8 + lVar9);
                  lVar10 = lVar10 + 1;
                }
                lVar9 = *(long *)((long)pvVar3 + 0x18) + lVar14;
                if (N <= lVar9) {
                  lVar9 = N + -1;
                }
                lVar7 = lVar7 + -8;
                bVar4 = lVar15 < lVar9;
                lVar15 = lVar15 + 1;
              } while (bVar4);
            }
            lVar14 = lVar14 + 1;
            lVar12 = lVar12 + 8;
          } while (lVar14 != M);
        }
      }
      *(long *)(*(long *)((long)p_Var6->content + 0x38) + lVar8 * 8) = lVar10;
      return p_Var6;
    }
  }
  return (SUNMatrix)0x0;
}

Assistant:

SUNMatrix SUNSparseFromBandMatrix(SUNMatrix Ad, realtype droptol, int sparsetype)
{
  sunindextype i, j, nnz;
  sunindextype M, N;
  SUNMatrix As;

  /* check for legal sparsetype, droptol and input matrix type */
  if ( (sparsetype != CSR_MAT) && (sparsetype != CSC_MAT) )
    return NULL;
  if ( droptol < ZERO )
    return NULL;
  if (SUNMatGetID(Ad) != SUNMATRIX_BAND)
    return NULL;
  
  /* set size of new matrix */
  M = SM_ROWS_B(Ad);
  N = SM_COLUMNS_B(Ad);

  /* determine total number of nonzeros */
  nnz = 0;
  for (j=0; j<N; j++)
    for (i=SUNMAX(0,j-SM_UBAND_B(Ad)); i<=SUNMIN(M-1,j+SM_LBAND_B(Ad)); i++)
      nnz += (SUNRabs(SM_ELEMENT_B(Ad,i,j)) > droptol);

  /* allocate sparse matrix */
  As = SUNSparseMatrix(M, N, nnz, sparsetype);
  if (As == NULL)  return NULL;

  /* copy nonzeros from Ad into As, based on CSR/CSC type */
  nnz = 0;
  if (sparsetype == CSC_MAT) {
    for (j=0; j<N; j++) {
      (SM_INDEXPTRS_S(As))[j] = nnz;
      for (i=SUNMAX(0,j-SM_UBAND_B(Ad)); i<=SUNMIN(M-1,j+SM_LBAND_B(Ad)); i++) {
        if ( SUNRabs(SM_ELEMENT_B(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = i;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_B(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[N] = nnz;
  } else {       /* CSR_MAT */
    for (i=0; i<M; i++) {
      (SM_INDEXPTRS_S(As))[i] = nnz;
      for (j=SUNMAX(0,i-SM_LBAND_B(Ad)); j<=SUNMIN(N-1,i+SM_UBAND_B(Ad)); j++) {
        if ( SUNRabs(SM_ELEMENT_B(Ad,i,j)) > droptol ) { 
          (SM_INDEXVALS_S(As))[nnz] = j;
          (SM_DATA_S(As))[nnz++] = SM_ELEMENT_B(Ad,i,j);
        }
      }
    }
    (SM_INDEXPTRS_S(As))[M] = nnz;
  }

  return(As);
}